

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

void ReadRegTestArgs(ArgsManager *args,RegTestOptions *options)

{
  pointer __s;
  string_view source_file;
  uint uVar1;
  bool bVar2;
  optional<bool> oVar3;
  optional<Consensus::BuriedDeployment> oVar4;
  int iVar5;
  void *pvVar6;
  uint *puVar7;
  mapped_type *pmVar8;
  Logger *pLVar9;
  runtime_error *prVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined8 uVar12;
  long lVar13;
  char *in_R8;
  VBDeploymentInfo *pVVar14;
  pointer this;
  undefined8 *puVar15;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view name;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view separators;
  string_view logging_function;
  VersionBitsParameters vbparams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vDeploymentParams;
  optional<Consensus::BuriedDeployment> buried_deployment;
  int32_t height;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> deployment_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  int *in_stack_fffffffffffffea8;
  undefined1 local_128 [32];
  long local_108;
  _Storage<Consensus::BuriedDeployment,_true> local_f8;
  bool bStack_f6;
  undefined1 uStack_f5;
  undefined4 uStack_f4;
  undefined8 *local_f0;
  uint local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-fastprune","");
  oVar3 = ArgsManager::GetBoolArg(args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->fastprune =
         oVar3.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-testactivationheight","");
  ArgsManager::GetArgs(&local_b8,args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      pbVar11 = in_RCX;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff;
      if (this->_M_string_length != 0) {
        __s = (this->_M_dataplus)._M_p;
        pvVar6 = memchr(__s,0x40,this->_M_string_length);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pvVar6 - (long)__s);
        in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (-(ulong)(pvVar6 == (void *)0x0) | (ulong)pbVar11);
      }
      if (in_RCX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0xffffffffffffffff) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&local_58,
                   (tinyformat *)"Invalid format (%s) for -testactivationheight=name@height.",
                   (char *)this,pbVar11);
        std::runtime_error::runtime_error(prVar10,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00d58f46;
      }
      uVar12 = 0xffffffffffffffff;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_58,this,(size_type)((long)&(in_RCX->_M_dataplus)._M_p + 1),
                 0xffffffffffffffff);
      str_00._M_str = local_58._M_dataplus._M_p;
      str_00._M_len = local_58._M_string_length;
      bVar2 = ParseInt32(str_00,(int32_t *)local_d8);
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71((int7)((ulong)uVar12 >> 8),local_d8[0] < 0x7fffffff);
      if (!bVar2 || local_d8[0] >= 0x7fffffff) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&local_78,
                   (tinyformat *)"Invalid height value (%s) for -testactivationheight=name@height.",
                   (char *)this,pbVar11);
        std::runtime_error::runtime_error(prVar10,(string *)&local_78);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00d58f46;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_78,this,0,(size_type)in_RCX);
      name._M_str = local_78._M_dataplus._M_p;
      name._M_len = local_78._M_string_length;
      oVar4 = GetBuriedDeployment(name);
      uVar1 = local_d8[0];
      local_f8._M_value =
           oVar4.super__Optional_base<Consensus::BuriedDeployment,_true,_true>._M_payload.
           super__Optional_payload_base<Consensus::BuriedDeployment>._M_payload;
      bStack_f6 = oVar4.super__Optional_base<Consensus::BuriedDeployment,_true,_true>._M_payload.
                  super__Optional_payload_base<Consensus::BuriedDeployment>._M_engaged;
      uStack_f5 = oVar4.super__Optional_base<Consensus::BuriedDeployment,_true,_true>._M_payload.
                  super__Optional_payload_base<Consensus::BuriedDeployment>._3_1_;
      if (bStack_f6 != true) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&local_98,
                   (tinyformat *)"Invalid name (%s) for -testactivationheight=name@height.",
                   (char *)this,in_RCX);
        std::runtime_error::runtime_error(prVar10,(string *)&local_98);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00d58f46;
      }
      puVar7 = (uint *)std::__detail::
                       _Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&options->activation_heights,&local_f8._M_value);
      *puVar7 = uVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      this = this + 1;
    } while (this != local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-vbparams","");
  bVar2 = ArgsManager::IsArgSet(args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (bVar2) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-vbparams","");
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8,args,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    puVar15 = (undefined8 *)
              CONCAT44(uStack_f4,CONCAT13(uStack_f5,CONCAT12(bStack_f6,local_f8._M_value)));
    if (puVar15 != local_f0) {
      do {
        separators._M_len = &local_78;
        local_58._M_dataplus._M_p = (pointer)*puVar15;
        local_58._M_string_length = puVar15[1];
        local_78._M_dataplus._M_p._0_1_ = 0x3a;
        separators._M_str = in_R8;
        util::Split<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_128 + 0x18),(util *)&local_58,(Span<const_char> *)0x1,separators);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_108 - local_128._24_8_ >> 5) - 5);
        if (pbVar11 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      0xfffffffffffffffe) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar10,
                     "Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]"
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00d58f46;
        }
        local_128._0_8_ = (pointer)0x0;
        local_128._8_8_ = 0;
        local_128._16_8_ = 0;
        str_01._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_128._24_8_ + 0x20))->_M_dataplus)._M_p;
        str_01._M_len = *(size_type *)(local_128._24_8_ + 0x28);
        bVar2 = ParseInt64(str_01,(int64_t *)local_128);
        if (!bVar2) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)"Invalid nStartTime (%s)",
                     (char *)(local_128._24_8_ + 0x20),pbVar11);
          std::runtime_error::runtime_error(prVar10,(string *)&local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00d58f46;
        }
        str_02._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_128._24_8_ + 0x40))->_M_dataplus)._M_p;
        str_02._M_len = *(size_type *)(local_128._24_8_ + 0x48);
        bVar2 = ParseInt64(str_02,(int64_t *)(local_128 + 8));
        if (!bVar2) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)"Invalid nTimeout (%s)",
                     (char *)(local_128._24_8_ + 0x40),pbVar11);
          std::runtime_error::runtime_error(prVar10,(string *)&local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00d58f46;
        }
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_108 - local_128._24_8_);
        if (pbVar11 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x61) {
          local_128._16_8_ = local_128._16_8_ & 0xffffffff00000000;
        }
        else {
          str_03._M_str =
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_128._24_8_ + 0x60))->_M_dataplus)._M_p;
          str_03._M_len = *(size_type *)(local_128._24_8_ + 0x68);
          bVar2 = ParseInt32(str_03,(int32_t *)(local_128 + 0x10));
          if (!bVar2) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            tinyformat::format<std::__cxx11::string>
                      (&local_58,(tinyformat *)"Invalid min_activation_height (%s)",
                       (char *)(local_128._24_8_ + 0x60),pbVar11);
            std::runtime_error::runtime_error(prVar10,(string *)&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00d58f46;
          }
        }
        pVVar14 = VersionBitsDeploymentInfo;
        lVar13 = 0;
        while (iVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_128._24_8_,pVVar14->name), iVar5 != 0) {
          lVar13 = lVar13 + 1;
          pVVar14 = pVVar14 + 1;
          if (lVar13 != 1) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            tinyformat::format<std::__cxx11::string>
                      (&local_58,(tinyformat *)"Invalid deployment (%s)",(char *)local_128._24_8_,
                       pbVar11);
            std::runtime_error::runtime_error(prVar10,(string *)&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00d58f46;
          }
        }
        local_58._M_dataplus._M_p._0_2_ = (short)lVar13;
        pmVar8 = std::__detail::
                 _Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)options,(key_type *)&local_58);
        uVar12 = local_128._24_8_;
        *(undefined8 *)&pmVar8->min_activation_height = local_128._16_8_;
        pmVar8->start_time = local_128._0_8_;
        pmVar8->timeout = local_128._8_8_;
        pLVar9 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar9);
        if (bVar2) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string,long,long,int>
                    (&local_78,
                     (tinyformat *)
                     "Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n"
                     ,(char *)uVar12,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     (long *)(local_128 + 8),(long *)(local_128 + 0x10),in_stack_fffffffffffffea8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_58,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          pLVar9 = LogInstance();
          local_78._M_dataplus._M_p = &DAT_00000058;
          local_78._M_string_length = 0x114f532;
          in_stack_fffffffffffffea8 = (int *)&DAT_00000058;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chainparams.cpp"
          ;
          source_file._M_len = 0x58;
          str._M_str = local_58._M_dataplus._M_p;
          str._M_len = local_58._M_string_length;
          logging_function._M_str = "ReadRegTestArgs";
          logging_function._M_len = 0xf;
          in_R8 = "ReadRegTestArgs";
          BCLog::Logger::LogPrintStr(pLVar9,str,logging_function,source_file,0x5e,ALL,Info);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_128 + 0x18));
        puVar15 = puVar15 + 4;
      } while (puVar15 != local_f0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00d58f46:
  __stack_chk_fail();
}

Assistant:

void ReadRegTestArgs(const ArgsManager& args, CChainParams::RegTestOptions& options)
{
    if (auto value = args.GetBoolArg("-fastprune")) options.fastprune = *value;

    for (const std::string& arg : args.GetArgs("-testactivationheight")) {
        const auto found{arg.find('@')};
        if (found == std::string::npos) {
            throw std::runtime_error(strprintf("Invalid format (%s) for -testactivationheight=name@height.", arg));
        }

        const auto value{arg.substr(found + 1)};
        int32_t height;
        if (!ParseInt32(value, &height) || height < 0 || height >= std::numeric_limits<int>::max()) {
            throw std::runtime_error(strprintf("Invalid height value (%s) for -testactivationheight=name@height.", arg));
        }

        const auto deployment_name{arg.substr(0, found)};
        if (const auto buried_deployment = GetBuriedDeployment(deployment_name)) {
            options.activation_heights[*buried_deployment] = height;
        } else {
            throw std::runtime_error(strprintf("Invalid name (%s) for -testactivationheight=name@height.", arg));
        }
    }

    if (!args.IsArgSet("-vbparams")) return;

    for (const std::string& strDeployment : args.GetArgs("-vbparams")) {
        std::vector<std::string> vDeploymentParams = SplitString(strDeployment, ':');
        if (vDeploymentParams.size() < 3 || 4 < vDeploymentParams.size()) {
            throw std::runtime_error("Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]");
        }
        CChainParams::VersionBitsParameters vbparams{};
        if (!ParseInt64(vDeploymentParams[1], &vbparams.start_time)) {
            throw std::runtime_error(strprintf("Invalid nStartTime (%s)", vDeploymentParams[1]));
        }
        if (!ParseInt64(vDeploymentParams[2], &vbparams.timeout)) {
            throw std::runtime_error(strprintf("Invalid nTimeout (%s)", vDeploymentParams[2]));
        }
        if (vDeploymentParams.size() >= 4) {
            if (!ParseInt32(vDeploymentParams[3], &vbparams.min_activation_height)) {
                throw std::runtime_error(strprintf("Invalid min_activation_height (%s)", vDeploymentParams[3]));
            }
        } else {
            vbparams.min_activation_height = 0;
        }
        bool found = false;
        for (int j=0; j < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++j) {
            if (vDeploymentParams[0] == VersionBitsDeploymentInfo[j].name) {
                options.version_bits_parameters[Consensus::DeploymentPos(j)] = vbparams;
                found = true;
                LogPrintf("Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n", vDeploymentParams[0], vbparams.start_time, vbparams.timeout, vbparams.min_activation_height);
                break;
            }
        }
        if (!found) {
            throw std::runtime_error(strprintf("Invalid deployment (%s)", vDeploymentParams[0]));
        }
    }
}